

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O3

sexp_conflict
sexp_thread_join(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict thread,
                sexp_conflict timeout)

{
  sexp_conflict psVar1;
  
  if ((((ulong)thread & 3) == 0) && (thread->tag == 0x24)) {
    if (0 < (thread->value).context.refuel) {
      *(undefined2 *)((long)&ctx->value + 0x60a2) = 0x100;
      (ctx->value).opcode.dl = thread;
      sexp_insert_timed(ctx,ctx,timeout);
      return (sexp_conflict)&DAT_0000003e;
    }
    return (sexp_conflict)0x13e;
  }
  psVar1 = (sexp_conflict)sexp_type_exception(ctx,self,0x24);
  return psVar1;
}

Assistant:

sexp sexp_thread_join (sexp ctx, sexp self, sexp_sint_t n, sexp thread, sexp timeout) {
  sexp_assert_type(ctx, sexp_contextp, SEXP_CONTEXT, thread);
  if (sexp_context_refuel(thread) <= 0) /* return true if already terminated */ {
    return SEXP_TRUE;
  }
  sexp_context_timeoutp(ctx) = 0;
  sexp_context_waitp(ctx) = 1;
  sexp_context_event(ctx) = thread;
  sexp_insert_timed(ctx, ctx, timeout);
  return SEXP_FALSE;
}